

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputedValues.cpp
# Opt level: O2

String * __thiscall
Rml::Style::ComputedValues::font_family_abi_cxx11_
          (String *__return_storage_ptr__,ComputedValues *this)

{
  Property *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  this_00 = Element::GetProperty(this->element,FontFamily);
  if (this_00 == (Property *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    Property::Get<std::__cxx11::string>(&local_30,this_00);
    ComputeFontFamily(__return_storage_ptr__,&local_30);
    ::std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

String Style::ComputedValues::font_family() const
{
	if (auto p = element->GetProperty(PropertyId::FontFamily))
		return ComputeFontFamily(p->Get<String>());

	return String();
}